

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext *ctx,ImGuiWindow *window,bool clear_persistent_docking_ref)

{
  undefined1 *puVar1;
  ImGuiDockNode *node;
  ImGuiID save_dock_id;
  
  node = (ImGuiDockNode *)(ctx->IO).MouseClickedTime[3];
  if (node == (ImGuiDockNode *)0x0) {
    (ctx->IO).MouseClicked[0] = false;
    (ctx->IO).MouseClicked[1] = false;
    (ctx->IO).MouseClicked[2] = false;
    (ctx->IO).MouseClicked[3] = false;
  }
  else {
    save_dock_id = 0;
    if ((char)window == '\0') {
      save_dock_id = *(ImGuiID *)(ctx->IO).MouseClicked;
    }
    DockNodeRemoveWindow(node,(ImGuiWindow *)ctx,save_dock_id);
  }
  *(undefined1 *)((long)&(ctx->IO).FontGlobalScale + 2) = 0;
  puVar1 = &(ctx->IO).field_0x432;
  *puVar1 = *puVar1 & 0xfc;
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    (void)ctx;
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockTabIsVisible = false;
    MarkIniSettingsDirty();
}